

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O1

int stbi__pnm_getinteger(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  iVar3 = 0;
  do {
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00118ca5:
      if (s->img_buffer_end <= s->img_buffer) {
        return iVar3;
      }
    }
    else {
      iVar2 = (*(s->io).eof)(s->io_user_data);
      if (iVar2 != 0) {
        if (s->read_from_callbacks == 0) {
          return iVar3;
        }
        goto LAB_00118ca5;
      }
    }
    if ((byte)(*c - 0x3aU) < 0xf6) {
      return iVar3;
    }
    iVar3 = (uint)(byte)*c + iVar3 * 10 + -0x30;
    sVar1 = stbi__get8(s);
    *c = sVar1;
    if ((0xccccccc < iVar3) || ('7' < (char)sVar1 && iVar3 == 0xccccccc)) {
      *(char **)(in_FS_OFFSET + -8) = "integer parse overflow";
      return 0;
    }
  } while( true );
}

Assistant:

static int      stbi__pnm_getinteger(stbi__context *s, char *c)
{
   int value = 0;

   while (!stbi__at_eof(s) && stbi__pnm_isdigit(*c)) {
      value = value*10 + (*c - '0');
      *c = (char) stbi__get8(s);
      if((value > 214748364) || (value == 214748364 && *c > '7'))
          return stbi__err("integer parse overflow", "Parsing an integer in the PPM header overflowed a 32-bit int");
   }

   return value;
}